

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_type_safe::nullopt_t_&,_const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&>
* __thiscall
Catch::ExprLhs<type_safe::nullopt_t_const&>::operator<=
          (BinaryExpr<const_type_safe::nullopt_t_&,_const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&>
           *__return_storage_ptr__,ExprLhs<type_safe::nullopt_t_const&> *this,
          basic_optional<type_safe::direct_optional_storage<int>_> *rhs)

{
  nullopt_t *pnVar1;
  StringRef local_30;
  
  pnVar1 = *(nullopt_t **)this;
  StringRef::StringRef(&local_30,"<=");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = true;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021de50;
  __return_storage_ptr__->m_lhs = pnVar1;
  (__return_storage_ptr__->m_op).m_start = local_30.m_start;
  (__return_storage_ptr__->m_op).m_size = local_30.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator <= ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs <= rhs), m_lhs, "<=", rhs };
        }